

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::ScalablePipeline(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                   *this,ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
                         *rhs)

{
  long in_RSI;
  size_type in_RDI;
  vector<tf::Task,_std::allocator<tf::Task>_> *this_00;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_01;
  ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
  *in_stack_00000090;
  queue<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff88;
  queue<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff90;
  size_type __new_size;
  
  __new_size = in_RDI;
  Graph::Graph((Graph *)0x15b995);
  *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  this_00 = (vector<tf::Task,_std::allocator<tf::Task>_> *)(in_RDI + 0x20);
  std::
  vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
  ::vector((vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
            *)in_stack_ffffffffffffff90,
           (vector<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
            *)in_stack_ffffffffffffff88);
  std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
            ((vector<tf::Task,_std::allocator<tf::Task>_> *)0x15b9d1);
  std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
            ((vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> *)in_stack_ffffffffffffff90,
             (vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> *)in_stack_ffffffffffffff88);
  std::
  unique_ptr<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[],_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
  ::unique_ptr((unique_ptr<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[],_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
                *)in_stack_ffffffffffffff90,
               (unique_ptr<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[],_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
                *)in_stack_ffffffffffffff88);
  std::
  queue<std::pair<unsigned_long,_unsigned_long>,_std::deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::queue(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_01 = (unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             *)(__new_size + 0xc0);
  std::
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::unordered_map(this_01,(unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           *)in_stack_ffffffffffffff88);
  std::
  unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
  ::unordered_map((unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
                   *)this_01,
                  (unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
                   *)in_stack_ffffffffffffff88);
  *(undefined8 *)(__new_size + 0x130) = *(undefined8 *)(in_RSI + 0x130);
  std::
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ::clear((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           *)0x15ba88);
  std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::size
            ((vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> *)(__new_size + 0x50));
  std::vector<tf::Task,_std::allocator<tf::Task>_>::resize(this_00,__new_size);
  *(undefined8 *)(in_RSI + 0x130) = 0;
  *(undefined8 *)(in_RSI + 0x18) = 0;
  std::vector<tf::Task,_std::allocator<tf::Task>_>::clear
            ((vector<tf::Task,_std::allocator<tf::Task>_> *)0x15badf);
  _build(in_stack_00000090);
  return;
}

Assistant:

ScalablePipeline<P>::ScalablePipeline(ScalablePipeline&& rhs):
  _num_tokens           {rhs._num_tokens},
  _pipes                {std::move(rhs._pipes)},
  _pipeflows            {std::move(rhs._pipeflows)},
  _lines                {std::move(rhs._lines)},
  _ready_tokens         {std::move(rhs._ready_tokens)},
  _token_dependencies   {std::move(rhs._token_dependencies)},
  _deferred_tokens      {std::move(rhs._deferred_tokens)},
  _longest_deferral     {rhs._longest_deferral}{


  //_num_tokens = rhs._num_tokens;

  //_pipes.resize(rhs.num_pipes());
  //size_t i=0;
  //for(auto itr = rhs._pipes.begin(); itr != rhs._pipes.end(); itr++) {
  //  _pipes[i++] = *itr;
  //}


  //_pipeflows.resize(rhs.num_lines());
  //for(size_t l = 0; l<rhs.num_lines(); l++) {
  //  _pipeflows[l]._pipe = rhs._pipeflows[l]._pipe;
  //  _pipeflows[l]._line = rhs._pipeflows[l]._line;
  //  _pipeflows[l]._num_deferrals = 0;
  //  _pipeflows[l]._dependents.clear();
  //}

  //_lines = std::make_unique<Line[]>(rhs.num_lines() * rhs._pipes.size());
  //for(size_t l=0; l<num_lines(); l++) {
  //  for(size_t f=0; f<num_pipes(); f++) {
  //    _line(l, f).join_counter.store(
  //      rhs._line(l, f).join_counter, std::memory_order_relaxed
  //    );
  //  }
  //}
 
  //_ready_tokens = std::move(rhs._ready_tokens);
  //_token_dependencies = std::move(rhs._token_dependencies);
  //_deferred_tokens = std::move(rhs._deferred_tokens);

  _graph.clear();
  _tasks.resize(_pipeflows.size()+1);
  rhs._longest_deferral = 0;
  rhs._num_tokens       = 0;
  rhs._tasks.clear();
  _build();
}